

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,char *string)

{
  long lVar1;
  QTextStreamPrivate *str;
  QTextStreamPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  QTextStreamPrivate *local_48;
  QUtf8StringView in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str = d_func((QTextStream *)0x14059f);
  if ((str->string != (QString *)0x0) || (local_48 = in_RDI, str->device != (QIODevice *)0x0)) {
    QBasicUtf8StringView<false>::QBasicUtf8StringView<const_char_*,_true>
              ((QBasicUtf8StringView<false> *)in_RDI,(char **)str);
    QTextStreamPrivate::putString(in_RDI,in_stack_ffffffffffffffd0,SUB81((ulong)str >> 0x38,0));
    local_48 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QTextStream *)local_48;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(const char *string)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putString(QUtf8StringView(string));
    return *this;
}